

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

int asio_service_test::response_hint_test(bool with_meta)

{
  RaftAsioPkg *this;
  long lVar1;
  long lVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  int32 iVar6;
  ostream *poVar7;
  pointer ppRVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int __how;
  int __how_00;
  int __how_01;
  pointer ppRVar9;
  int __fd;
  size_t ii;
  unsigned_long uVar10;
  int __how_02;
  __atomic_base<unsigned_long> _Var11;
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_01;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_02;
  buffer_serializer bs;
  allocator_type local_5a1;
  buffer_serializer bs_2;
  ptr<buffer> msg;
  raft_params params;
  ptr<buffer> msg_2;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  atomic<unsigned_long> write_resp_cb_count;
  atomic<unsigned_long> read_resp_cb_count;
  atomic<unsigned_long> write_req_cb_count;
  atomic<unsigned_long> read_req_cb_count;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_4b0;
  undefined1 local_4a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  undefined1 local_480 [16];
  string s3_addr;
  string s2_addr;
  string s1_addr;
  RaftAsioPkg s1;
  WRITE_META_FUNC local_2f0;
  READ_META_FUNC local_2d0;
  WRITE_META_FUNC local_2b0;
  READ_META_FUNC local_290;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  
  __how_02 = (int)&bs;
  __fd = (int)&bs;
  raft_functional_common::reset_log_files();
  std::__cxx11::string::string((string *)&s1_addr,"localhost:20010",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s2_addr,"localhost:20020",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s3_addr,"localhost:20030",(allocator *)&s1);
  RaftAsioPkg::RaftAsioPkg(&s1,1,&s1_addr);
  RaftAsioPkg::RaftAsioPkg(&s2,2,&s2_addr);
  RaftAsioPkg::RaftAsioPkg(&s3,3,&s3_addr);
  __l._M_len = 3;
  __l._M_array = (iterator)&params;
  params._0_8_ = &s1;
  params._8_8_ = &s2;
  params._16_8_ = &s3;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&pkgs,__l,(allocator_type *)&bs);
  TestSuite::_msg("launching asio-raft servers %s\n");
  ppRVar8 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  read_req_cb_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  write_req_cb_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  read_resp_cb_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  write_resp_cb_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  for (ppRVar9 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppRVar9 != ppRVar8; ppRVar9 = ppRVar9 + 1) {
    if (with_meta) {
      this = *ppRVar9;
      params._0_8_ = test_read_req_meta;
      params._8_8_ = &read_req_cb_count;
      std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
      function<std::_Bind<bool(*(std::atomic<unsigned_long>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
                ((function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>
                  *)&local_290,
                 (_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&params);
      bs._0_8_ = test_write_req_meta_abi_cxx11_;
      bs.buf_ = (buffer *)&write_req_cb_count;
      std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
      function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
                ((function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)> *)
                 &local_2b0,
                 (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
                  *)&bs);
      bs_2._0_8_ = test_read_resp_meta;
      bs_2.buf_ = (buffer *)&read_resp_cb_count;
      std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
      function<std::_Bind<bool(*(std::atomic<unsigned_long>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
                ((function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>
                  *)&local_2d0,
                 (_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&bs_2);
      msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)test_write_resp_meta_abi_cxx11_;
      msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&write_resp_cb_count;
      std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
      function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
                ((function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)> *)
                 &local_2f0,
                 (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
                  *)&msg);
      RaftAsioPkg::setMetaCallback(this,&local_290,&local_2b0,&local_2d0,&local_2f0,true);
      std::_Function_base::~_Function_base(&local_2f0.super__Function_base);
      std::_Function_base::~_Function_base(&local_2d0.super__Function_base);
      std::_Function_base::~_Function_base(&local_2b0.super__Function_base);
      std::_Function_base::~_Function_base(&local_290.super__Function_base);
    }
  }
  params._0_8_ = params._0_8_ & 0xffffffffffffff00;
  params.heart_beat_interval_ = 0;
  params.rpc_failure_backoff_ = 0;
  params.log_sync_batch_size_ = 0;
  params.log_sync_stop_gap_ = 0;
  params.snapshot_distance_ = 0;
  params.snapshot_block_size_ = 0;
  params.enable_randomized_snapshot_creation_ = false;
  params._33_3_ = 0;
  params.max_append_size_ = 0;
  params.reserved_log_items_._0_2_ = 1;
  iVar5 = launch_servers(&pkgs,false,false,true,(init_options *)&params);
  std::_Function_base::~_Function_base((_Function_base *)&params.heart_beat_interval_);
  if (iVar5 != 0) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"        time: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)&params);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"      thread: ");
    poVar7 = std::operator<<(poVar7,"\x1b[33m");
    lVar1 = *(long *)poVar7;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          in: ");
    poVar7 = std::operator<<(poVar7,"\x1b[36m");
    poVar7 = std::operator<<(poVar7,"response_hint_test");
    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          at: ");
    poVar7 = std::operator<<(poVar7,"\x1b[32m");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28f);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
    poVar7 = std::operator<<(poVar7,"0");
    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
    iVar5 = -1;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
    std::operator<<(poVar7,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&params);
    TestSuite::failHandler();
    goto LAB_00188ec3;
  }
  TestSuite::_msg("enable batch size hint with positive value\n");
  for (ppRVar8 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppRVar8 !=
      pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar8 = ppRVar8 + 1) {
    LOCK();
    ((*ppRVar8)->sm).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    [0x1c]._vptr_state_machine = (_func_int **)0x1;
    UNLOCK();
  }
  TestSuite::_msg("organizing raft group\n");
  iVar5 = make_group(&pkgs);
  if (iVar5 != 0) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"        time: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)&params);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"      thread: ");
    poVar7 = std::operator<<(poVar7,"\x1b[33m");
    lVar1 = *(long *)poVar7;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          in: ");
    poVar7 = std::operator<<(poVar7,"\x1b[36m");
    poVar7 = std::operator<<(poVar7,"response_hint_test");
    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          at: ");
    poVar7 = std::operator<<(poVar7,"\x1b[32m");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x297);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
    poVar7 = std::operator<<(poVar7,"0");
    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
    iVar5 = -1;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
    std::operator<<(poVar7,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&params);
    TestSuite::failHandler();
    goto LAB_00188ec3;
  }
  if ((((s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       leader_).super___atomic_base<int>._M_i ==
       (s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       id_) && (((s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->role_)._M_i == leader)) {
    iVar6 = nuraft::raft_server::get_leader
                      (s1.raftServer.
                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (iVar6 == 1) {
      iVar6 = nuraft::raft_server::get_leader
                        (s2.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (iVar6 == 1) {
        iVar6 = nuraft::raft_server::get_leader
                          (s3.raftServer.
                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar6 == 1) {
          std::__cxx11::string::string
                    ((string *)&params,"wait for Raft group ready",(allocator *)&bs);
          TestSuite::sleep_sec(1,(string *)&params);
          std::__cxx11::string::~string((string *)&params);
          for (uVar10 = 0; uVar10 != 100; uVar10 = uVar10 + 1) {
            std::__cxx11::to_string((string *)&params,uVar10);
            nuraft::buffer::alloc
                      ((buffer *)&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                       ,params._8_8_ + 4);
            nuraft::buffer_serializer::buffer_serializer
                      (&bs,(ptr<buffer> *)
                           &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                       LITTLE);
            nuraft::buffer_serializer::put_str(&bs,(string *)&params);
            peVar3 = s1.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                       &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
            __l_00._M_len = 1;
            __l_00._M_array =
                 (iterator)&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
            std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      *)&bs_2,__l_00,(allocator_type *)&local_4b0);
            nuraft::raft_server::append_entries
                      ((raft_server *)local_480,
                       (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        *)peVar3);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_480 + 8));
            std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                       *)&bs_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__cxx11::string::~string((string *)&params);
          }
          std::__cxx11::string::string((string *)&params,"wait for replication",(allocator *)&bs);
          TestSuite::sleep_sec(1,(string *)&params);
          std::__cxx11::string::~string((string *)&params);
          bVar4 = raft_functional_common::TestSm::isSame
                            ((TestSm *)
                             s2.sm.
                             super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,(TestSm *)
                                    s1.sm.
                                    super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,false);
          if (bVar4) {
            bVar4 = raft_functional_common::TestSm::isSame
                              ((TestSm *)
                               s3.sm.
                               super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,(TestSm *)
                                       s1.sm.
                                       super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,false);
            if (bVar4) {
              TestSuite::_msg("disable batch size hint\n");
              for (ppRVar8 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  ppRVar8 !=
                  pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                  super__Vector_impl_data._M_finish; ppRVar8 = ppRVar8 + 1) {
                LOCK();
                ((*ppRVar8)->sm).
                super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x1c].
                _vptr_state_machine = (_func_int **)0x0;
                UNLOCK();
              }
              for (uVar10 = 0; uVar10 != 100; uVar10 = uVar10 + 1) {
                std::__cxx11::to_string((string *)&bs,uVar10);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"2nd_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &bs);
                std::__cxx11::string::~string((string *)&bs);
                nuraft::buffer::alloc
                          ((buffer *)
                           &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                           params._8_8_ + 4);
                nuraft::buffer_serializer::buffer_serializer
                          (&bs,(ptr<buffer> *)
                               &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                           LITTLE);
                nuraft::buffer_serializer::put_str(&bs,(string *)&params);
                peVar3 = s1.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                           &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
                __l_01._M_len = 1;
                __l_01._M_array =
                     (iterator)&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                ;
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          *)&bs_2,__l_01,(allocator_type *)&local_4b0);
                nuraft::raft_server::append_entries
                          ((raft_server *)(local_4a0 + 0x10),
                           (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                            *)peVar3);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_488);
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           *)&bs_2);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::string::~string((string *)&params);
              }
              std::__cxx11::string::string
                        ((string *)&params,"wait for replication",(allocator *)&bs);
              TestSuite::sleep_sec(1,(string *)&params);
              std::__cxx11::string::~string((string *)&params);
              bVar4 = raft_functional_common::TestSm::isSame
                                ((TestSm *)
                                 s2.sm.
                                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,(TestSm *)
                                         s1.sm.
                                         super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,false);
              if (bVar4) {
                bVar4 = raft_functional_common::TestSm::isSame
                                  ((TestSm *)
                                   s3.sm.
                                   super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(TestSm *)
                                           s1.sm.
                                           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,false);
                if (bVar4) {
                  TestSuite::_msg("enable batch size hint with negative value\n");
                  for (; pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                         _M_impl.super__Vector_impl_data._M_start !=
                         pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                      pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl
                      .super__Vector_impl_data._M_start =
                           pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1) {
                    LOCK();
                    ((*pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)->sm).
                    super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [0x1c]._vptr_state_machine = (_func_int **)0xffffffffffffffff;
                    UNLOCK();
                  }
                  std::__cxx11::string::string
                            ((string *)&params,
                             "wait peer\'s hint size info refreshed in leader side",(allocator *)&bs
                            );
                  TestSuite::sleep_sec(1,(string *)&params);
                  std::__cxx11::string::~string((string *)&params);
                  nuraft::raft_server::get_current_params
                            (&params,s1.raftServer.
                                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
                  params.client_req_timeout_ = 1000;
                  nuraft::raft_server::update_params
                            (s1.raftServer.
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&params);
                  for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
                    std::__cxx11::to_string((string *)&bs_2,uVar10);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bs,"3rd_",(string *)&bs_2);
                    std::__cxx11::string::~string((string *)&bs_2);
                    nuraft::buffer::alloc
                              ((buffer *)
                               &msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                               ,(size_t)(bs.buf_ + 4));
                    nuraft::buffer_serializer::buffer_serializer
                              (&bs_2,(ptr<buffer> *)
                                     &msg_2.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                               ,LITTLE);
                    nuraft::buffer_serializer::put_str(&bs_2,(string *)&bs);
                    peVar3 = s1.raftServer.
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&local_4b0,
                               &msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                              );
                    __l_02._M_len = 1;
                    __l_02._M_array = (iterator)&local_4b0;
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                              *)&msg,__l_02,&local_5a1);
                    nuraft::raft_server::append_entries
                              ((raft_server *)local_4a0,
                               (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                *)peVar3);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4a0 + 8));
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                               *)&msg);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_4b0._M_refcount);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    std::__cxx11::string::~string((string *)&bs);
                  }
                  std::__cxx11::string::string
                            ((string *)&bs,"wait for replication but actually no replication happen"
                             ,(allocator *)&bs_2);
                  TestSuite::sleep_sec(1,(string *)&bs);
                  std::__cxx11::string::~string((string *)&bs);
                  bVar4 = raft_functional_common::TestSm::isSame
                                    ((TestSm *)
                                     s2.sm.
                                     super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,(TestSm *)
                                             s1.sm.
                                             super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr,false);
                  if (bVar4) {
                    bVar4 = raft_functional_common::TestSm::isSame
                                      ((TestSm *)
                                       s3.sm.
                                       super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,(TestSm *)
                                               s1.sm.
                                               super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr,false);
                    iVar5 = (int)s1.sm.
                                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                    if (bVar4) {
                      __how = extraout_EDX;
                      if (!with_meta) {
LAB_0018a344:
                        nuraft::raft_server::shutdown
                                  (s1.raftServer.
                                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,iVar5,__how);
                        nuraft::raft_server::shutdown
                                  (s2.raftServer.
                                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,iVar5,__how_00);
                        nuraft::raft_server::shutdown
                                  (s3.raftServer.
                                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,iVar5,__how_01);
                        std::__cxx11::string::string
                                  ((string *)&bs,"shutting down",(allocator *)&bs_2);
                        TestSuite::sleep_sec(1,(string *)&bs);
                        std::__cxx11::string::~string((string *)&bs);
                        iVar5 = 0;
                        SimpleLogger::shutdown(__fd,__how_02);
                        goto LAB_00188ec3;
                      }
                      iVar5 = (int)read_req_cb_count.super___atomic_base<unsigned_long>._M_i;
                      if (iVar5 < 1) {
                        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        poVar7 = std::operator<<(poVar7,"        time: ");
                        poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar7 = std::operator<<(poVar7,(string *)&bs);
                        poVar7 = std::operator<<(poVar7,"\x1b[0m");
                        poVar7 = std::operator<<(poVar7,"\n");
                        poVar7 = std::operator<<(poVar7,"      thread: ");
                        poVar7 = std::operator<<(poVar7,"\x1b[33m");
                        lVar1 = *(long *)poVar7;
                        lVar2 = *(long *)(lVar1 + -0x18);
                        *(uint *)(poVar7 + lVar2 + 0x18) =
                             *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
                        *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                        poVar7 = std::operator<<(poVar7,0x30);
                        bs_2._0_8_ = pthread_self();
                        std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        poVar7 = std::operator<<(poVar7,"\x1b[0m");
                        poVar7 = std::operator<<(poVar7,"\n");
                        poVar7 = std::operator<<(poVar7,"          in: ");
                        poVar7 = std::operator<<(poVar7,"\x1b[36m");
                        poVar7 = std::operator<<(poVar7,"response_hint_test");
                        poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                        poVar7 = std::operator<<(poVar7,"\n");
                        poVar7 = std::operator<<(poVar7,"          at: ");
                        poVar7 = std::operator<<(poVar7,"\x1b[32m");
                        poVar7 = std::operator<<(poVar7,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                );
                        poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                        poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2db);
                        poVar7 = std::operator<<(poVar7,"\x1b[0m");
                        poVar7 = std::operator<<(poVar7,"\n");
                        poVar7 = std::operator<<(poVar7,"    expected: ");
                        poVar7 = std::operator<<(poVar7,
                                                 "\x1b[1;34mread_req_cb_count.load() > 0\x1b[0m\n");
                        poVar7 = std::operator<<(poVar7,"    value of ");
                        poVar7 = std::operator<<(poVar7,
                                                 "\x1b[1;32mread_req_cb_count.load()\x1b[0m: ");
                        poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                        poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                        poVar7 = std::operator<<(poVar7,"    value of ");
                        poVar7 = std::operator<<(poVar7,"\x1b[1;32m0\x1b[0m: ");
                        poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                        std::operator<<(poVar7,"\x1b[0m\n");
                        std::__cxx11::string::~string((string *)&bs);
                        TestSuite::failHandler();
                      }
                      else {
                        iVar5 = (int)write_req_cb_count.super___atomic_base<unsigned_long>._M_i;
                        if (iVar5 < 1) {
                          poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          poVar7 = std::operator<<(poVar7,"        time: ");
                          poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                          TestSuite::getTimeString_abi_cxx11_();
                          poVar7 = std::operator<<(poVar7,(string *)&bs);
                          poVar7 = std::operator<<(poVar7,"\x1b[0m");
                          poVar7 = std::operator<<(poVar7,"\n");
                          poVar7 = std::operator<<(poVar7,"      thread: ");
                          poVar7 = std::operator<<(poVar7,"\x1b[33m");
                          lVar1 = *(long *)poVar7;
                          lVar2 = *(long *)(lVar1 + -0x18);
                          *(uint *)(poVar7 + lVar2 + 0x18) =
                               *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
                          *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                          poVar7 = std::operator<<(poVar7,0x30);
                          bs_2._0_8_ = pthread_self();
                          std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          poVar7 = std::operator<<(poVar7,"\x1b[0m");
                          poVar7 = std::operator<<(poVar7,"\n");
                          poVar7 = std::operator<<(poVar7,"          in: ");
                          poVar7 = std::operator<<(poVar7,"\x1b[36m");
                          poVar7 = std::operator<<(poVar7,"response_hint_test");
                          poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                          poVar7 = std::operator<<(poVar7,"\n");
                          poVar7 = std::operator<<(poVar7,"          at: ");
                          poVar7 = std::operator<<(poVar7,"\x1b[32m");
                          poVar7 = std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                          poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                          poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2dc);
                          poVar7 = std::operator<<(poVar7,"\x1b[0m");
                          poVar7 = std::operator<<(poVar7,"\n");
                          poVar7 = std::operator<<(poVar7,"    expected: ");
                          poVar7 = std::operator<<(poVar7,
                                                  "\x1b[1;34mwrite_req_cb_count.load() > 0\x1b[0m\n"
                                                  );
                          poVar7 = std::operator<<(poVar7,"    value of ");
                          poVar7 = std::operator<<(poVar7,
                                                  "\x1b[1;32mwrite_req_cb_count.load()\x1b[0m: ");
                          poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                          poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                          poVar7 = std::operator<<(poVar7,"    value of ");
                          poVar7 = std::operator<<(poVar7,"\x1b[1;32m0\x1b[0m: ");
                          poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                          std::operator<<(poVar7,"\x1b[0m\n");
                          std::__cxx11::string::~string((string *)&bs);
                          TestSuite::failHandler();
                        }
                        else {
                          iVar5 = (int)read_resp_cb_count.super___atomic_base<unsigned_long>._M_i;
                          if (iVar5 < 1) {
                            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                            poVar7 = std::operator<<(poVar7,"        time: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                            TestSuite::getTimeString_abi_cxx11_();
                            poVar7 = std::operator<<(poVar7,(string *)&bs);
                            poVar7 = std::operator<<(poVar7,"\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"      thread: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[33m");
                            lVar1 = *(long *)poVar7;
                            lVar2 = *(long *)(lVar1 + -0x18);
                            *(uint *)(poVar7 + lVar2 + 0x18) =
                                 *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
                            *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                            poVar7 = std::operator<<(poVar7,0x30);
                            bs_2._0_8_ = pthread_self();
                            std::hash<std::thread::id>::operator()
                                      ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                 0xffffffb5 | 2;
                            poVar7 = std::operator<<(poVar7,"\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"          in: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[36m");
                            poVar7 = std::operator<<(poVar7,"response_hint_test");
                            poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"          at: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[32m");
                            poVar7 = std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                            poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2dd);
                            poVar7 = std::operator<<(poVar7,"\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"    expected: ");
                            poVar7 = std::operator<<(poVar7,
                                                  "\x1b[1;34mread_resp_cb_count.load() > 0\x1b[0m\n"
                                                  );
                            poVar7 = std::operator<<(poVar7,"    value of ");
                            poVar7 = std::operator<<(poVar7,
                                                  "\x1b[1;32mread_resp_cb_count.load()\x1b[0m: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                            poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                            poVar7 = std::operator<<(poVar7,"    value of ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;32m0\x1b[0m: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                            std::operator<<(poVar7,"\x1b[0m\n");
                            std::__cxx11::string::~string((string *)&bs);
                            TestSuite::failHandler();
                          }
                          else {
                            iVar5 = (int)write_resp_cb_count.super___atomic_base<unsigned_long>._M_i
                            ;
                            if (0 < iVar5) {
                              TestSuite::_msg("read req callback %zu, write req callback %zu\n",
                                              read_req_cb_count.super___atomic_base<unsigned_long>.
                                              _M_i,write_req_cb_count.
                                                   super___atomic_base<unsigned_long>._M_i);
                              _Var11 = read_resp_cb_count.super___atomic_base<unsigned_long>._M_i;
                              TestSuite::_msg("read resp callback %zu, write resp callback %zu\n",
                                              read_resp_cb_count.super___atomic_base<unsigned_long>.
                                              _M_i,write_resp_cb_count.
                                                   super___atomic_base<unsigned_long>._M_i);
                              iVar5 = (int)_Var11._M_i;
                              __how = extraout_EDX_00;
                              goto LAB_0018a344;
                            }
                            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                            poVar7 = std::operator<<(poVar7,"        time: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                            TestSuite::getTimeString_abi_cxx11_();
                            poVar7 = std::operator<<(poVar7,(string *)&bs);
                            poVar7 = std::operator<<(poVar7,"\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"      thread: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[33m");
                            lVar1 = *(long *)poVar7;
                            lVar2 = *(long *)(lVar1 + -0x18);
                            *(uint *)(poVar7 + lVar2 + 0x18) =
                                 *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
                            *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                            poVar7 = std::operator<<(poVar7,0x30);
                            bs_2._0_8_ = pthread_self();
                            std::hash<std::thread::id>::operator()
                                      ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                 0xffffffb5 | 2;
                            poVar7 = std::operator<<(poVar7,"\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"          in: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[36m");
                            poVar7 = std::operator<<(poVar7,"response_hint_test");
                            poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"          at: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[32m");
                            poVar7 = std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                            poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2de);
                            poVar7 = std::operator<<(poVar7,"\x1b[0m");
                            poVar7 = std::operator<<(poVar7,"\n");
                            poVar7 = std::operator<<(poVar7,"    expected: ");
                            poVar7 = std::operator<<(poVar7,
                                                  "\x1b[1;34mwrite_resp_cb_count.load() > 0\x1b[0m\n"
                                                  );
                            poVar7 = std::operator<<(poVar7,"    value of ");
                            poVar7 = std::operator<<(poVar7,
                                                  "\x1b[1;32mwrite_resp_cb_count.load()\x1b[0m: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                            poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                            poVar7 = std::operator<<(poVar7,"    value of ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;32m0\x1b[0m: ");
                            poVar7 = std::operator<<(poVar7,"\x1b[1;31m");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
                            std::operator<<(poVar7,"\x1b[0m\n");
                            std::__cxx11::string::~string((string *)&bs);
                            TestSuite::failHandler();
                          }
                        }
                      }
                      goto LAB_00188ec0;
                    }
                    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    poVar7 = std::operator<<(poVar7,"        time: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar7 = std::operator<<(poVar7,(string *)&bs);
                    poVar7 = std::operator<<(poVar7,"\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,"      thread: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[33m");
                    lVar1 = *(long *)poVar7;
                    lVar2 = *(long *)(lVar1 + -0x18);
                    *(uint *)(poVar7 + lVar2 + 0x18) =
                         *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
                    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                    poVar7 = std::operator<<(poVar7,0x30);
                    bs_2._0_8_ = pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    poVar7 = std::operator<<(poVar7,"\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,"          in: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[36m");
                    poVar7 = std::operator<<(poVar7,"response_hint_test");
                    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,"          at: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[32m");
                    poVar7 = std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                            );
                    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2d7);
                    poVar7 = std::operator<<(poVar7,"\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,
                                             "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                            );
                    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
                    poVar7 = std::operator<<(poVar7,"true");
                    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
                    poVar7 = std::operator<<(poVar7,"false");
                    std::operator<<(poVar7,"\x1b[0m\n");
                  }
                  else {
                    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    poVar7 = std::operator<<(poVar7,"        time: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar7 = std::operator<<(poVar7,(string *)&bs);
                    poVar7 = std::operator<<(poVar7,"\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,"      thread: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[33m");
                    lVar1 = *(long *)poVar7;
                    lVar2 = *(long *)(lVar1 + -0x18);
                    *(uint *)(poVar7 + lVar2 + 0x18) =
                         *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
                    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                    poVar7 = std::operator<<(poVar7,0x30);
                    bs_2._0_8_ = pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    poVar7 = std::operator<<(poVar7,"\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,"          in: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[36m");
                    poVar7 = std::operator<<(poVar7,"response_hint_test");
                    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,"          at: ");
                    poVar7 = std::operator<<(poVar7,"\x1b[32m");
                    poVar7 = std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                            );
                    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2d6);
                    poVar7 = std::operator<<(poVar7,"\x1b[0m");
                    poVar7 = std::operator<<(poVar7,"\n");
                    poVar7 = std::operator<<(poVar7,
                                             "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                            );
                    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
                    poVar7 = std::operator<<(poVar7,"true");
                    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
                    poVar7 = std::operator<<(poVar7,"false");
                    std::operator<<(poVar7,"\x1b[0m\n");
                  }
                  std::__cxx11::string::~string((string *)&bs);
                  TestSuite::failHandler();
                  goto LAB_00188ec0;
                }
                poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                poVar7 = std::operator<<(poVar7,"        time: ");
                poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar7 = std::operator<<(poVar7,(string *)&params);
                poVar7 = std::operator<<(poVar7,"\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,"      thread: ");
                poVar7 = std::operator<<(poVar7,"\x1b[33m");
                lVar1 = *(long *)poVar7;
                lVar2 = *(long *)(lVar1 + -0x18);
                *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8
                ;
                *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                poVar7 = std::operator<<(poVar7,0x30);
                bs._0_8_ = pthread_self();
                std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar7 = std::operator<<(poVar7,"\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,"          in: ");
                poVar7 = std::operator<<(poVar7,"\x1b[36m");
                poVar7 = std::operator<<(poVar7,"response_hint_test");
                poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,"          at: ");
                poVar7 = std::operator<<(poVar7,"\x1b[32m");
                poVar7 = std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                        );
                poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2bd);
                poVar7 = std::operator<<(poVar7,"\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,
                                         "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                        );
                poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
                poVar7 = std::operator<<(poVar7,"true");
                poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
                poVar7 = std::operator<<(poVar7,"false");
                std::operator<<(poVar7,"\x1b[0m\n");
              }
              else {
                poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                poVar7 = std::operator<<(poVar7,"        time: ");
                poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar7 = std::operator<<(poVar7,(string *)&params);
                poVar7 = std::operator<<(poVar7,"\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,"      thread: ");
                poVar7 = std::operator<<(poVar7,"\x1b[33m");
                lVar1 = *(long *)poVar7;
                lVar2 = *(long *)(lVar1 + -0x18);
                *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8
                ;
                *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
                poVar7 = std::operator<<(poVar7,0x30);
                bs._0_8_ = pthread_self();
                std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar7 = std::operator<<(poVar7,"\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,"          in: ");
                poVar7 = std::operator<<(poVar7,"\x1b[36m");
                poVar7 = std::operator<<(poVar7,"response_hint_test");
                poVar7 = std::operator<<(poVar7,"()\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,"          at: ");
                poVar7 = std::operator<<(poVar7,"\x1b[32m");
                poVar7 = std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                        );
                poVar7 = std::operator<<(poVar7,"\x1b[0m:");
                poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,700);
                poVar7 = std::operator<<(poVar7,"\x1b[0m");
                poVar7 = std::operator<<(poVar7,"\n");
                poVar7 = std::operator<<(poVar7,
                                         "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                        );
                poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
                poVar7 = std::operator<<(poVar7,"true");
                poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
                poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
                poVar7 = std::operator<<(poVar7,"false");
                std::operator<<(poVar7,"\x1b[0m\n");
              }
            }
            else {
              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              poVar7 = std::operator<<(poVar7,"        time: ");
              poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
              TestSuite::getTimeString_abi_cxx11_();
              poVar7 = std::operator<<(poVar7,(string *)&params);
              poVar7 = std::operator<<(poVar7,"\x1b[0m");
              poVar7 = std::operator<<(poVar7,"\n");
              poVar7 = std::operator<<(poVar7,"      thread: ");
              poVar7 = std::operator<<(poVar7,"\x1b[33m");
              lVar1 = *(long *)poVar7;
              lVar2 = *(long *)(lVar1 + -0x18);
              *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
              *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
              poVar7 = std::operator<<(poVar7,0x30);
              bs._0_8_ = pthread_self();
              std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
              poVar7 = std::operator<<(poVar7,"\x1b[0m");
              poVar7 = std::operator<<(poVar7,"\n");
              poVar7 = std::operator<<(poVar7,"          in: ");
              poVar7 = std::operator<<(poVar7,"\x1b[36m");
              poVar7 = std::operator<<(poVar7,"response_hint_test");
              poVar7 = std::operator<<(poVar7,"()\x1b[0m");
              poVar7 = std::operator<<(poVar7,"\n");
              poVar7 = std::operator<<(poVar7,"          at: ");
              poVar7 = std::operator<<(poVar7,"\x1b[32m");
              poVar7 = std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                      );
              poVar7 = std::operator<<(poVar7,"\x1b[0m:");
              poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2ab);
              poVar7 = std::operator<<(poVar7,"\x1b[0m");
              poVar7 = std::operator<<(poVar7,"\n");
              poVar7 = std::operator<<(poVar7,
                                       "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                      );
              poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
              poVar7 = std::operator<<(poVar7,"true");
              poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
              poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
              poVar7 = std::operator<<(poVar7,"false");
              std::operator<<(poVar7,"\x1b[0m\n");
            }
          }
          else {
            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar7 = std::operator<<(poVar7,"        time: ");
            poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar7 = std::operator<<(poVar7,(string *)&params);
            poVar7 = std::operator<<(poVar7,"\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"      thread: ");
            poVar7 = std::operator<<(poVar7,"\x1b[33m");
            lVar1 = *(long *)poVar7;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
            poVar7 = std::operator<<(poVar7,0x30);
            bs._0_8_ = pthread_self();
            std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar7 = std::operator<<(poVar7,"\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"          in: ");
            poVar7 = std::operator<<(poVar7,"\x1b[36m");
            poVar7 = std::operator<<(poVar7,"response_hint_test");
            poVar7 = std::operator<<(poVar7,"()\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,"          at: ");
            poVar7 = std::operator<<(poVar7,"\x1b[32m");
            poVar7 = std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar7 = std::operator<<(poVar7,"\x1b[0m:");
            poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2aa);
            poVar7 = std::operator<<(poVar7,"\x1b[0m");
            poVar7 = std::operator<<(poVar7,"\n");
            poVar7 = std::operator<<(poVar7,
                                     "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                    );
            poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
            poVar7 = std::operator<<(poVar7,"true");
            poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
            poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
            poVar7 = std::operator<<(poVar7,"false");
            std::operator<<(poVar7,"\x1b[0m\n");
          }
          std::__cxx11::string::~string((string *)&params);
          TestSuite::failHandler();
        }
        else {
          poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar7 = std::operator<<(poVar7,"        time: ");
          poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::operator<<(poVar7,(string *)&params);
          poVar7 = std::operator<<(poVar7,"\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"      thread: ");
          poVar7 = std::operator<<(poVar7,"\x1b[33m");
          lVar1 = *(long *)poVar7;
          lVar2 = *(long *)(lVar1 + -0x18);
          *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
          poVar7 = std::operator<<(poVar7,0x30);
          bs._0_8_ = pthread_self();
          std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar7 = std::operator<<(poVar7,"\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"          in: ");
          poVar7 = std::operator<<(poVar7,"\x1b[36m");
          poVar7 = std::operator<<(poVar7,"response_hint_test");
          poVar7 = std::operator<<(poVar7,"()\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"          at: ");
          poVar7 = std::operator<<(poVar7,"\x1b[32m");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar7 = std::operator<<(poVar7,"\x1b[0m:");
          poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29c);
          poVar7 = std::operator<<(poVar7,"\x1b[0m");
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,
                                   "    value of: \x1b[1;34ms3.raftServer->get_leader()\x1b[0m\n");
          poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
          poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
          poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
          std::operator<<(poVar7,"\x1b[0m\n");
          std::__cxx11::string::~string((string *)&params);
          TestSuite::failHandler();
        }
      }
      else {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar7 = std::operator<<(poVar7,"        time: ");
        poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::operator<<(poVar7,(string *)&params);
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"      thread: ");
        poVar7 = std::operator<<(poVar7,"\x1b[33m");
        lVar1 = *(long *)poVar7;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
        poVar7 = std::operator<<(poVar7,0x30);
        bs._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"          in: ");
        poVar7 = std::operator<<(poVar7,"\x1b[36m");
        poVar7 = std::operator<<(poVar7,"response_hint_test");
        poVar7 = std::operator<<(poVar7,"()\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"          at: ");
        poVar7 = std::operator<<(poVar7,"\x1b[32m");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar7 = std::operator<<(poVar7,"\x1b[0m:");
        poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29b);
        poVar7 = std::operator<<(poVar7,"\x1b[0m");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,
                                 "    value of: \x1b[1;34ms2.raftServer->get_leader()\x1b[0m\n");
        poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
        poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
        poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        std::operator<<(poVar7,"\x1b[0m\n");
        std::__cxx11::string::~string((string *)&params);
        TestSuite::failHandler();
      }
    }
    else {
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar7 = std::operator<<(poVar7,"        time: ");
      poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,(string *)&params);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"      thread: ");
      poVar7 = std::operator<<(poVar7,"\x1b[33m");
      lVar1 = *(long *)poVar7;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
      poVar7 = std::operator<<(poVar7,0x30);
      bs._0_8_ = pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          in: ");
      poVar7 = std::operator<<(poVar7,"\x1b[36m");
      poVar7 = std::operator<<(poVar7,"response_hint_test");
      poVar7 = std::operator<<(poVar7,"()\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"          at: ");
      poVar7 = std::operator<<(poVar7,"\x1b[32m");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar7 = std::operator<<(poVar7,"\x1b[0m:");
      poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29a);
      poVar7 = std::operator<<(poVar7,"\x1b[0m");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34ms1.raftServer->get_leader()\x1b[0m\n"
                              );
      poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
      poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
      poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      std::operator<<(poVar7,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&params);
      TestSuite::failHandler();
    }
  }
  else {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"        time: ");
    poVar7 = std::operator<<(poVar7,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::operator<<(poVar7,(string *)&params);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"      thread: ");
    poVar7 = std::operator<<(poVar7,"\x1b[33m");
    lVar1 = *(long *)poVar7;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          in: ");
    poVar7 = std::operator<<(poVar7,"\x1b[36m");
    poVar7 = std::operator<<(poVar7,"response_hint_test");
    poVar7 = std::operator<<(poVar7,"()\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"          at: ");
    poVar7 = std::operator<<(poVar7,"\x1b[32m");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar7 = std::operator<<(poVar7,"\x1b[0m:");
    poVar7 = std::operator<<(poVar7,"\x1b[1;35m");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x299);
    poVar7 = std::operator<<(poVar7,"\x1b[0m");
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"    value of: \x1b[1;34ms1.raftServer->is_leader()\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"    expected: \x1b[1;32m");
    poVar7 = std::operator<<(poVar7,"true");
    poVar7 = std::operator<<(poVar7,"\x1b[0m\n");
    poVar7 = std::operator<<(poVar7,"      actual: \x1b[1;31m");
    poVar7 = std::operator<<(poVar7,"false");
    std::operator<<(poVar7,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&params);
    TestSuite::failHandler();
  }
LAB_00188ec0:
  iVar5 = -1;
LAB_00188ec3:
  std::_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>);
  RaftAsioPkg::~RaftAsioPkg(&s3);
  RaftAsioPkg::~RaftAsioPkg(&s2);
  RaftAsioPkg::~RaftAsioPkg(&s1);
  std::__cxx11::string::~string((string *)&s3_addr);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  return iVar5;
}

Assistant:

int response_hint_test(bool with_meta) {
    reset_log_files();

    std::string s1_addr = "localhost:20010";
    std::string s2_addr = "localhost:20020";
    std::string s3_addr = "localhost:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    _msg("launching asio-raft servers %s\n",
         with_meta ? "(with meta)" : "");
    std::atomic<size_t> read_req_cb_count(0);
    std::atomic<size_t> write_req_cb_count(0);
    std::atomic<size_t> read_resp_cb_count(0);
    std::atomic<size_t> write_resp_cb_count(0);
    for (RaftAsioPkg* ee: pkgs) {
        if (with_meta) {
            ee->setMetaCallback
                ( std::bind( test_read_req_meta,
                             &read_req_cb_count,
                             std::placeholders::_1,
                             std::placeholders::_2 ),
                  std::bind( test_write_req_meta,
                             &write_req_cb_count,
                             std::placeholders::_1 ),
                  std::bind( test_read_resp_meta,
                             &read_resp_cb_count,
                             std::placeholders::_1,
                             std::placeholders::_2 ),
                  std::bind( test_write_resp_meta,
                             &write_resp_cb_count,
                             std::placeholders::_1 ),
                  true );
        }
    }
    CHK_Z( launch_servers(pkgs, false) );

    _msg("enable batch size hint with positive value\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(1);
    }

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    CHK_TRUE( s1.raftServer->is_leader() );
    CHK_EQ(1, s1.raftServer->get_leader());
    CHK_EQ(1, s2.raftServer->get_leader());
    CHK_EQ(1, s3.raftServer->get_leader());
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    const size_t NUM = 100;
    for (size_t ii=0; ii<NUM; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    _msg("disable batch size hint\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(0);
    }

    for (size_t ii=0; ii<NUM; ++ii) {
        std::string msg_str = "2nd_" + std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    _msg("enable batch size hint with negative value\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(-1);
    }

    TestSuite::sleep_sec(1, "wait peer's hint size info refreshed in leader side");

    // With negative hint size, append_entries will timeout due to
    // raft server can not commit. Set timeout to a small value.
    raft_params params = s1.raftServer->get_current_params();
    params.with_client_req_timeout(1000);
    s1.raftServer->update_params(params);

    for (size_t ii=0; ii<3; ++ii) {
        std::string msg_str = "3rd_" + std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication but actually no replication happen");

    // State machine should be identical. All are not committed.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    if (with_meta) {
        // Callback functions for meta should have been called.
        CHK_GT(read_req_cb_count.load(), 0);
        CHK_GT(write_req_cb_count.load(), 0);
        CHK_GT(read_resp_cb_count.load(), 0);
        CHK_GT(write_resp_cb_count.load(), 0);
        _msg( "read req callback %zu, write req callback %zu\n",
              read_req_cb_count.load(), write_req_cb_count.load() );
        _msg( "read resp callback %zu, write resp callback %zu\n",
              read_resp_cb_count.load(), write_resp_cb_count.load() );
    }

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}